

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int rngStreamTest(char *filename,char *resul,char *errr,int options)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  xmlTextReaderPtr reader;
  int in_R9D;
  ulong uVar7;
  glob_t globbuf;
  char prefix [500];
  char err [500];
  char pattern [500];
  char result [500];
  int local_888;
  glob64_t local_870;
  undefined4 local_828;
  undefined4 uStack_824;
  short local_820;
  char local_628 [499];
  undefined1 local_435;
  char local_428 [499];
  undefined1 local_235;
  char local_228 [499];
  undefined1 local_35;
  
  pcVar4 = baseFilename(filename);
  sVar5 = strlen(pcVar4);
  if ((int)sVar5 - 500U < 0xfffffe11) {
    fprintf(_stderr,"len(base) == %d !\n",sVar5 & 0xffffffff);
    return -1;
  }
  uVar7 = (ulong)((int)sVar5 - 4);
  memcpy(&local_828,pcVar4,uVar7);
  *(undefined1 *)((long)&local_828 + uVar7) = 0;
  if (((local_820 != 0x31 || CONCAT44(uStack_824,local_828) != 0x5f3031726f747574) &&
      (local_820 != 0x32 || CONCAT44(uStack_824,local_828) != 0x5f3031726f747574)) &&
     ((char)local_820 != '\0' || CONCAT44(uStack_824,local_828) != 0x325f33726f747574)) {
    if ((CONCAT31((undefined3)uStack_824,local_828._3_1_) != 0x373733 || local_828 != 0x33373033) &&
       ((char)local_820 != '\0' || CONCAT44(uStack_824,local_828) != 0x325f38726f747574)) {
      bVar2 = false;
      goto LAB_00108559;
    }
  }
  bVar2 = true;
LAB_00108559:
  local_888 = 0;
  iVar3 = snprintf(local_428,499,"./test/relaxng/%s_?.xml",&local_828);
  if (0x1f2 < iVar3) {
    local_235 = 0;
  }
  local_870.gl_offs = 0;
  glob64(local_428,8,(__errfunc *)0x0,&local_870);
  if (local_870.gl_pathc != 0) {
    uVar7 = 0;
    local_888 = 0;
    do {
      testErrorsSize = 0;
      testErrors[0] = '\0';
      pcVar4 = local_870.gl_pathv[uVar7];
      pcVar6 = baseFilename(pcVar4);
      sVar5 = strlen(pcVar6);
      iVar3 = (int)sVar5;
      if ((iVar3 < 7) || (pcVar6[iVar3 - 6] != '_')) {
        pcVar6 = "don\'t know how to process %s\n";
LAB_00108725:
        fprintf(_stderr,pcVar6,pcVar4);
      }
      else {
        cVar1 = pcVar6[iVar3 - 5];
        iVar3 = snprintf(local_228,499,"result/relaxng/%s_%c",&local_828,(ulong)(uint)(int)cVar1);
        if (0x1f2 < iVar3) {
          local_35 = 0;
        }
        iVar3 = snprintf(local_628,499,"result/relaxng/%s_%c.err",&local_828,(ulong)(uint)(int)cVar1
                        );
        if (0x1f2 < iVar3) {
          local_435 = 0;
        }
        reader = (xmlTextReaderPtr)xmlReaderForFile(pcVar4,0,options);
        if (reader == (xmlTextReaderPtr)0x0) {
          fprintf(_stderr,"Failed to build reader for %s\n",pcVar4);
        }
        if (bVar2) {
          pcVar6 = (char *)0x0;
        }
        else {
          pcVar6 = local_628;
        }
        iVar3 = streamProcessTest(pcVar4,local_228,pcVar6,reader,filename,in_R9D);
        xmlFreeTextReader(reader);
        if (iVar3 != 0) {
          local_888 = -1;
          pcVar6 = "instance %s failed\n";
          goto LAB_00108725;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < local_870.gl_pathc);
  }
  globfree64(&local_870);
  return local_888;
}

Assistant:

static int
rngStreamTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    int res = 0, len, ret;
    char pattern[500];
    char prefix[500];
    char result[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;
    xmlTextReaderPtr reader;
    int disable_err = 0;

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
	fprintf(stderr, "len(base) == %d !\n", len);
	return(-1);
    }
    len -= 4; /* remove trailing .rng */
    memcpy(prefix, base, len);
    prefix[len] = 0;

    /*
     * strictly unifying the error messages is nearly impossible this
     * hack is also done in the Makefile
     */
    if ((!strcmp(prefix, "tutor10_1")) || (!strcmp(prefix, "tutor10_2")) ||
        (!strcmp(prefix, "tutor3_2")) || (!strcmp(prefix, "307377")) ||
        (!strcmp(prefix, "tutor8_2")))
	disable_err = 1;

    if (snprintf(pattern, 499, "./test/relaxng/%s_?.xml", prefix) >= 499)
        pattern[499] = 0;

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = 0;
	testErrors[0] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(result, 499, "result/relaxng/%s_%c",
		     prefix, count);
            if (ret >= 499)
	        result[499] = 0;
	    ret = snprintf(err, 499, "result/relaxng/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}
	reader = xmlReaderForFile(instance, NULL, options);
	if (reader == NULL) {
	    fprintf(stderr, "Failed to build reader for %s\n", instance);
	}
	if (disable_err == 1)
	    ret = streamProcessTest(instance, result, NULL, reader, filename,
	                            options);
	else
	    ret = streamProcessTest(instance, result, err, reader, filename,
	                            options);
	xmlFreeTextReader(reader);
	if (ret != 0) {
	    fprintf(stderr, "instance %s failed\n", instance);
	    res = ret;
	}
    }
    globfree(&globbuf);

    return(res);
}